

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O3

bool dxil_spv::value_is_statically_wave_uniform(Impl *impl,Value *value)

{
  bool bVar1;
  ValueKind VVar2;
  CallInst *pCVar3;
  Value *pVVar4;
  ExtractValueInst *this;
  uint index;
  
  bVar1 = value_is_dx_op_instrinsic(value,AnnotateNodeHandle);
  if (bVar1) {
    pCVar3 = LLVMBC::cast<LLVMBC::CallInst>(value);
    pVVar4 = LLVMBC::Instruction::getOperand(&pCVar3->super_Instruction,1);
    bVar1 = value_is_dx_op_instrinsic(pVVar4,IndexNodeHandle);
    if (!bVar1) {
      return true;
    }
    pCVar3 = LLVMBC::cast<LLVMBC::CallInst>(pVVar4);
    value = LLVMBC::Instruction::getOperand(&pCVar3->super_Instruction,2);
  }
  if (value == (Value *)0x0) {
    value = (Value *)0x0;
  }
  else {
    this = (ExtractValueInst *)LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)this);
    if (VVar2 == ExtractValue) {
      value = LLVMBC::ExtractValueInst::getAggregateOperand(this);
    }
  }
  pVVar4 = LLVMBC::Internal::resolve_proxy(value);
  VVar2 = LLVMBC::Value::get_value_kind(pVVar4);
  bVar1 = LLVMBC::Constant::is_base_of_value_kind(VVar2);
  if (bVar1) {
    return true;
  }
  bVar1 = value_is_dx_op_instrinsic(value,WaveActiveOp);
  if (bVar1) {
    return true;
  }
  bVar1 = value_is_dx_op_instrinsic(value,WaveActiveAllEqual);
  if (bVar1) {
    return true;
  }
  bVar1 = value_is_dx_op_instrinsic(value,WaveActiveBit);
  if (bVar1) {
    return true;
  }
  bVar1 = value_is_dx_op_instrinsic(value,WaveActiveBallot);
  if (bVar1) {
    return true;
  }
  bVar1 = value_is_dx_op_instrinsic(value,WaveAnyTrue);
  if (bVar1) {
    return true;
  }
  bVar1 = value_is_dx_op_instrinsic(value,WaveAllTrue);
  if (!bVar1) {
    bVar1 = value_is_dx_op_instrinsic(value,WaveReadLaneFirst);
    if (bVar1) {
      return true;
    }
    bVar1 = value_is_dx_op_instrinsic(value,GroupId);
    if (!bVar1) {
      bVar1 = value_is_dx_op_instrinsic(value,CBufferLoadLegacy);
      if ((bVar1) || (bVar1 = value_is_dx_op_instrinsic(value,CBufferLoad), bVar1)) {
        pCVar3 = LLVMBC::cast<LLVMBC::CallInst>(value);
        index = 2;
      }
      else {
        bVar1 = value_is_dx_op_instrinsic(value,BufferLoad);
        if ((!bVar1) && (bVar1 = value_is_dx_op_instrinsic(value,RawBufferLoad), !bVar1)) {
          return false;
        }
        pCVar3 = LLVMBC::cast<LLVMBC::CallInst>(value);
        pVVar4 = LLVMBC::Instruction::getOperand(&pCVar3->super_Instruction,2);
        bVar1 = value_is_statically_wave_uniform(impl,pVVar4);
        if (!bVar1) {
          return false;
        }
        index = 3;
      }
      pVVar4 = LLVMBC::Instruction::getOperand(&pCVar3->super_Instruction,index);
      bVar1 = value_is_statically_wave_uniform(impl,pVVar4);
      if (!bVar1) {
        return false;
      }
      pVVar4 = LLVMBC::Instruction::getOperand(&pCVar3->super_Instruction,1);
      bVar1 = resource_handle_is_uniform_readonly_descriptor(impl,pVVar4);
      return bVar1;
    }
    return true;
  }
  return true;
}

Assistant:

bool value_is_statically_wave_uniform(Converter::Impl &impl, const llvm::Value *value)
{
	// A surprising amount of shaders try to broadcast a value that is provably wave-uniform already.
	// Just forward this directly ...
	// This is an SSA value, so the input must dominate the use. The active threads here must be a subset of
	// the active threads when the wave uniform value was generated, so it is impossible for the input value to
	// not be wave uniform. We might end up promoting an undef value to not undef, but that is fine, since undef is ...
	// well, undef.

	if (value_is_dx_op_instrinsic(value, DXIL::Op::AnnotateNodeHandle))
	{
		auto *node = llvm::cast<llvm::CallInst>(value)->getOperand(1);
		// This is a static index.
		if (!value_is_dx_op_instrinsic(node, DXIL::Op::IndexNodeHandle))
			return true;

		// If the array index is wave uniform, the handle is wave uniform.
		value = llvm::cast<llvm::CallInst>(node)->getOperand(2);
	}

	// Buffer loads usually go through extractvalue first.
	// Ignore extractelement, it's only used in esoteric cases in DXR.
	if (const auto *extract = llvm::dyn_cast<llvm::ExtractValueInst>(value))
		value = extract->getAggregateOperand();

	if (llvm::isa<llvm::Constant>(value))
		return true;

	if (value_is_dx_op_instrinsic(value, DXIL::Op::WaveActiveOp) ||
	    value_is_dx_op_instrinsic(value, DXIL::Op::WaveActiveAllEqual) ||
	    value_is_dx_op_instrinsic(value, DXIL::Op::WaveActiveBit) ||
	    value_is_dx_op_instrinsic(value, DXIL::Op::WaveActiveBallot) ||
	    value_is_dx_op_instrinsic(value, DXIL::Op::WaveAnyTrue) ||
	    value_is_dx_op_instrinsic(value, DXIL::Op::WaveAllTrue) ||
	    value_is_dx_op_instrinsic(value, DXIL::Op::WaveReadLaneFirst) ||
	    value_is_dx_op_instrinsic(value, DXIL::Op::GroupId))
	{
		return true;
	}

	// Also detect loading a provably uniform value. This happens as well for some reason ...
	if (value_is_dx_op_instrinsic(value, DXIL::Op::CBufferLoadLegacy) ||
	    value_is_dx_op_instrinsic(value, DXIL::Op::CBufferLoad))
	{
		auto *call_op = llvm::cast<llvm::CallInst>(value);
		return value_is_statically_wave_uniform(impl, call_op->getOperand(2)) &&
		       resource_handle_is_uniform_readonly_descriptor(impl, call_op->getOperand(1));
	}
	else if (value_is_dx_op_instrinsic(value, DXIL::Op::BufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::RawBufferLoad))
	{
		auto *call_op = llvm::cast<llvm::CallInst>(value);

		// For byte-address-buffers, arg 3 will be undef and treated as wave uniform (it's a constant).
		return value_is_statically_wave_uniform(impl, call_op->getOperand(2)) &&
		       value_is_statically_wave_uniform(impl, call_op->getOperand(3)) &&
		       resource_handle_is_uniform_readonly_descriptor(impl, call_op->getOperand(1));
	}

	return false;
}